

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

char ** new_attrib(char **in)

{
  char **ppcVar1;
  char *pcVar2;
  uint local_20;
  uint local_1c;
  uint32 i;
  uint32 len;
  char **out;
  char **in_local;
  
  for (local_1c = 0; in[local_1c] != (char *)0x0; local_1c = local_1c + 1) {
  }
  ppcVar1 = (char **)__ckd_calloc__((ulong)(local_1c + 1),8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                                    ,0xd0);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    pcVar2 = strdup(in[local_20]);
    ppcVar1[local_20] = pcVar2;
  }
  ppcVar1[local_20] = (char *)0x0;
  return ppcVar1;
}

Assistant:

char **new_attrib(const char **in)
{
    char **out;
    uint32 len, i;

    for (len = 0; in[len]; len++);

    out = (char **)ckd_calloc(len+1, sizeof(char *));

    for (i = 0; i < len; i++) {
	out[i] = strdup(in[i]);
    }

    out[i] = NULL;

    return out;
}